

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O0

bool __thiscall rw::Clump::streamWrite(Clump *this,Stream *stream)

{
  LLLink *pLVar1;
  Light *pLVar2;
  Camera *pCVar3;
  uint32 uVar4;
  int32 iVar5;
  Frame *pFVar6;
  LLLink *pLVar7;
  Atomic *pAVar8;
  Light *pLVar9;
  Camera *pCVar10;
  int frm_1;
  Camera *c;
  LLLink *lnk_4;
  LLLink *_next_4;
  int frm;
  Light *l;
  LLLink *lnk_3;
  LLLink *_next_3;
  LLLink *lnk_2;
  LLLink *_next_2;
  LLLink *lnk_1;
  LLLink *_next_1;
  LLLink *lnk;
  LLLink *_next;
  FrameList_ frmlst;
  int32 buf [3];
  int32 numCameras;
  int32 numLights;
  int32 numAtomics;
  int size;
  Stream *stream_local;
  Clump *this_local;
  
  uVar4 = streamGetSize(this);
  writeChunkHeader(stream,0x10,uVar4);
  iVar5 = countAtomics(this);
  countLights(this);
  countCameras(this);
  uVar4 = 4;
  if (0x33000 < version) {
    uVar4 = 0xc;
  }
  frmlst.frames._4_4_ = iVar5;
  writeChunkHeader(stream,1,uVar4);
  Stream::write32(stream,(void *)((long)&frmlst.frames + 4),uVar4);
  pFVar6 = getFrame(this);
  _next._0_4_ = Frame::count(pFVar6);
  frmlst._0_8_ = malloc_LOC((long)(int32)_next << 3,0x10010,
                            "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/clump.cpp line: 302"
                           );
  pFVar6 = getFrame(this);
  makeFrameList(pFVar6,(Frame **)frmlst._0_8_);
  FrameList_::streamWrite((FrameList_ *)&_next,stream);
  if (0x303ff < version) {
    numLights = 0x10;
    _next_1 = (this->atomics).link.next;
    while( true ) {
      pLVar1 = _next_1->next;
      pLVar7 = LinkList::end(&this->atomics);
      if (_next_1 == pLVar7) break;
      pAVar8 = Atomic::fromClump(_next_1);
      uVar4 = Geometry::streamGetSize(pAVar8->geometry);
      numLights = uVar4 + 0xc + numLights;
      _next_1 = pLVar1;
    }
    writeChunkHeader(stream,0x1a,numLights);
    writeChunkHeader(stream,1,4);
    Stream::writeI32(stream,iVar5);
    _next_2 = (this->atomics).link.next;
    while( true ) {
      pLVar1 = _next_2->next;
      pLVar7 = LinkList::end(&this->atomics);
      if (_next_2 == pLVar7) break;
      pAVar8 = Atomic::fromClump(_next_2);
      Geometry::streamWrite(pAVar8->geometry,stream);
      _next_2 = pLVar1;
    }
  }
  _next_3 = (this->atomics).link.next;
  while( true ) {
    pLVar1 = _next_3->next;
    pLVar7 = LinkList::end(&this->atomics);
    if (_next_3 == pLVar7) break;
    pAVar8 = Atomic::fromClump(_next_3);
    Atomic::streamWriteClump(pAVar8,stream,(FrameList_ *)&_next);
    _next_3 = pLVar1;
  }
  l = (Light *)(this->lights).link.next;
  while( true ) {
    pLVar2 = *(Light **)&(l->object).object;
    pLVar9 = (Light *)LinkList::end(&this->lights);
    if (l == pLVar9) {
      c = (Camera *)(this->cameras).link.next;
      while( true ) {
        pCVar3 = *(Camera **)&(c->object).object;
        pCVar10 = (Camera *)LinkList::end(&this->cameras);
        if (c == pCVar10) {
          (*DAT_00168638)(frmlst._0_8_);
          PluginList::streamWrite((PluginList *)&s_plglist,stream,this);
          return true;
        }
        pCVar10 = Camera::fromClump((LLLink *)c);
        pFVar6 = Camera::getFrame(pCVar10);
        iVar5 = findPointer(pFVar6,(void **)frmlst._0_8_,(int32)_next);
        if (iVar5 < 0) break;
        writeChunkHeader(stream,1,4);
        Stream::writeI32(stream,iVar5);
        Camera::streamWrite(pCVar10,stream);
        c = pCVar3;
      }
      return false;
    }
    pLVar9 = Light::fromClump((LLLink *)l);
    pFVar6 = Light::getFrame(pLVar9);
    iVar5 = findPointer(pFVar6,(void **)frmlst._0_8_,(int32)_next);
    if (iVar5 < 0) break;
    writeChunkHeader(stream,1,4);
    Stream::writeI32(stream,iVar5);
    Light::streamWrite(pLVar9,stream);
    l = pLVar2;
  }
  return false;
}

Assistant:

bool
Clump::streamWrite(Stream *stream)
{
	int size = this->streamGetSize();
	writeChunkHeader(stream, ID_CLUMP, size);
	int32 numAtomics = this->countAtomics();
	int32 numLights = this->countLights();
	int32 numCameras = this->countCameras();
	int32 buf[3] = { numAtomics, numLights, numCameras };
	size = version > 0x33000 ? 12 : 4;
	writeChunkHeader(stream, ID_STRUCT, size);
	stream->write32(buf, size);

	FrameList_ frmlst;
	frmlst.numFrames = this->getFrame()->count();
	frmlst.frames = (Frame**)rwMalloc(frmlst.numFrames*sizeof(Frame*), MEMDUR_FUNCTION | ID_CLUMP);
	makeFrameList(this->getFrame(), frmlst.frames);
	frmlst.streamWrite(stream);

	if(rw::version >= 0x30400){
		size = 12+4;
		FORLIST(lnk, this->atomics)
			size += 12 + Atomic::fromClump(lnk)->geometry->streamGetSize();
		writeChunkHeader(stream, ID_GEOMETRYLIST, size);
		writeChunkHeader(stream, ID_STRUCT, 4);
		stream->writeI32(numAtomics);	// same as numGeometries
		FORLIST(lnk, this->atomics)
			Atomic::fromClump(lnk)->geometry->streamWrite(stream);
	}

	FORLIST(lnk, this->atomics)
		Atomic::fromClump(lnk)->streamWriteClump(stream, &frmlst);

	FORLIST(lnk, this->lights){
		Light *l = Light::fromClump(lnk);
		int frm = findPointer(l->getFrame(), (void**)frmlst.frames, frmlst.numFrames);
		if(frm < 0)
			return false;
		writeChunkHeader(stream, ID_STRUCT, 4);
		stream->writeI32(frm);
		l->streamWrite(stream);
	}

	FORLIST(lnk, this->cameras){
		Camera *c = Camera::fromClump(lnk);
		int frm = findPointer(c->getFrame(), (void**)frmlst.frames, frmlst.numFrames);
		if(frm < 0)
			return false;
		writeChunkHeader(stream, ID_STRUCT, 4);
		stream->writeI32(frm);
		c->streamWrite(stream);
	}

	rwFree(frmlst.frames);

	s_plglist.streamWrite(stream, this);
	return true;
}